

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImDrawList *this_00;
  ImU32 col_00;
  int iVar7;
  ImPlotContext *pIVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  ImVec2 IVar12;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_78;
  ImVec2 local_70;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar8 = GImPlot;
  col_00 = (ImU32)DrawList;
  local_68 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar3 = *(int *)(this + 0x10);
    local_48 = iVar3 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = col_00;
    dVar10 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                       (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3 &
                                       0xffffffff);
    pIVar6 = GImPlot;
    dVar11 = log10(in_XMM1_Qa / GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
    iVar3 = *(int *)&getter->Getter;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar3].Range.Min;
    local_3c.x = (float)((dVar10 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
                        (double)pIVar6->PixelRange[iVar3].Min.x);
    local_3c.y = (float)((((double)(float)(dVar11 / pIVar6->LogDenY[iVar3]) *
                           (pIVar4->YAxis[iVar3].Range.Max - dVar2) + dVar2) - dVar2) *
                         pIVar6->My[iVar3] + (double)pIVar6->PixelRange[iVar3].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLog> *)local_58,local_68
               ,&pIVar8->CurrentPlot->PlotRect);
  }
  else {
    iVar3 = *(int *)(this + 0x10);
    dVar10 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                       (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3 &
                                       0xffffffff);
    pIVar6 = GImPlot;
    dVar11 = log10(in_XMM1_Qa / GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
    iVar3 = *(int *)&getter->Getter;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar3].Range.Min;
    IVar12.x = (float)((dVar10 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
                      (double)pIVar6->PixelRange[iVar3].Min.x);
    IVar12.y = (float)((((double)(float)(dVar11 / pIVar6->LogDenY[iVar3]) *
                         (pIVar4->YAxis[iVar3].Range.Max - dVar2) + dVar2) - dVar2) *
                       pIVar6->My[iVar3] + (double)pIVar6->PixelRange[iVar3].Min.y);
    iVar3 = *(int *)(this + 0x10);
    if (1 < iVar3) {
      iVar7 = 1;
      local_60 = pIVar8;
      local_58 = (undefined1  [8])IVar12;
      do {
        dVar10 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                           (long)((*(int *)(this + 0x14) + iVar7) % iVar3 + iVar3) %
                                           (long)iVar3 & 0xffffffff);
        pIVar6 = GImPlot;
        dVar11 = log10((double)IVar12 /
                       GImPlot->CurrentPlot->YAxis[*(int *)&getter->Getter].Range.Min);
        this_00 = local_68;
        iVar3 = *(int *)&getter->Getter;
        pIVar4 = pIVar6->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar3].Range.Min;
        local_78.x = (float)((dVar10 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
                            (double)pIVar6->PixelRange[iVar3].Min.x);
        fVar9 = (float)((((double)(float)(dVar11 / pIVar6->LogDenY[iVar3]) *
                          (pIVar4->YAxis[iVar3].Range.Max - dVar2) + dVar2) - dVar2) *
                        pIVar6->My[iVar3] + (double)pIVar6->PixelRange[iVar3].Min.y);
        local_78.y = fVar9;
        pIVar4 = pIVar8->CurrentPlot;
        IVar12.y = 0.0;
        IVar12.x = fVar9;
        fVar5 = (float)local_58._4_4_;
        if (fVar9 <= (float)local_58._4_4_) {
          fVar5 = fVar9;
        }
        if ((fVar5 < (pIVar4->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar9 <= (float)local_58._4_4_) & (uint)fVar9 |
                           -(uint)(fVar9 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          IVar12.y = 0.0;
          IVar12.x = local_78.x;
          fVar5 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar5 = local_78.x;
          }
          if ((fVar5 < (pIVar4->PlotRect).Max.x) &&
             (fVar5 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar4->PlotRect).Min.x)) {
            local_70.y = (float)local_58._4_4_;
            local_70.x = local_78.x;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_70,col_00,line_weight);
            pIVar8 = local_60;
            ImDrawList::AddLine(this_00,&local_70,&local_78,col_00,line_weight);
          }
        }
        local_58._0_4_ = local_78.x;
        local_58._4_4_ = local_78.y;
        iVar7 = iVar7 + 1;
        iVar3 = *(int *)(this + 0x10);
      } while (iVar7 < iVar3);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}